

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void SexMessage(char *from,char *to,int gender,char *victim,char *killer)

{
  char cVar1;
  bool bVar2;
  size_t __n;
  char *__s;
  long lVar3;
  
  do {
    if (*from != '%') {
      *to = *from;
      goto LAB_003fb619;
    }
    bVar2 = true;
    switch(from[1]) {
    case 'g':
      __s = (char *)0x0;
      bVar2 = false;
      lVar3 = 0;
      goto LAB_003fb649;
    case 'h':
      lVar3 = 1;
      goto LAB_003fb644;
    default:
      __s = (char *)0x0;
      break;
    case 'k':
      __s = killer;
      break;
    case 'o':
      __s = victim;
      break;
    case 'p':
      lVar3 = 2;
LAB_003fb644:
      __s = (char *)0x0;
      bVar2 = false;
      goto LAB_003fb649;
    }
    lVar3 = 0xffffffff;
LAB_003fb649:
    if (__s == (char *)0x0) {
      if (!bVar2) {
        strcpy(to,SexMessage::genderstuff[gender][lVar3]);
        __n = (size_t)SexMessage::gendershift[gender][lVar3];
        goto LAB_003fb692;
      }
      *to = '%';
LAB_003fb619:
      to = to + 1;
    }
    else {
      __n = strlen(__s);
      memcpy(to,__s,__n);
LAB_003fb692:
      to = to + __n;
      from = from + 1;
    }
    cVar1 = *from;
    from = from + 1;
    if (cVar1 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void SexMessage (const char *from, char *to, int gender, const char *victim, const char *killer)
{
	static const char *genderstuff[3][3] =
	{
		{ "he",  "him", "his" },
		{ "she", "her", "her" },
		{ "it",  "it",  "its" }
	};
	static const int gendershift[3][3] =
	{
		{ 2, 3, 3 },
		{ 3, 3, 3 },
		{ 2, 2, 3 }
	};
	const char *subst = NULL;

	do
	{
		if (*from != '%')
		{
			*to++ = *from;
		}
		else
		{
			int gendermsg = -1;
			
			switch (from[1])
			{
			case 'g':	gendermsg = 0;	break;
			case 'h':	gendermsg = 1;	break;
			case 'p':	gendermsg = 2;	break;
			case 'o':	subst = victim;	break;
			case 'k':	subst = killer;	break;
			}
			if (subst != NULL)
			{
				size_t len = strlen (subst);
				memcpy (to, subst, len);
				to += len;
				from++;
				subst = NULL;
			}
			else if (gendermsg < 0)
			{
				*to++ = '%';
			}
			else
			{
				strcpy (to, genderstuff[gender][gendermsg]);
				to += gendershift[gender][gendermsg];
				from++;
			}
		}
	} while (*from++);
}